

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_extract.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::StructExtractBindInternal
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,bool struct_extract)

{
  LogicalType *type;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  pointer pEVar4;
  child_list_t<LogicalType> *this_00;
  reference pvVar5;
  type expr;
  ulong params;
  unsigned_long uVar6;
  const_reference pvVar7;
  undefined8 *puVar8;
  BinderException *pBVar9;
  InternalException *this_01;
  ParameterNotResolvedException *this_02;
  Value key_val;
  Value local_90;
  string local_50;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if ((pEVar4->return_type).id_ == UNKNOWN) {
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_02);
  }
  else {
    type = &pEVar4->return_type;
    this_00 = StructType::GetChildTypes_abi_cxx11_(type);
    if ((this_00->
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_90.type_._0_8_ = (long)&local_90 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Can\'t extract something from an empty struct","");
      InternalException::InternalException(this_01,(string *)&local_90);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (struct_extract) {
      bVar1 = StructType::IsUnnamed(type);
      if (!bVar1) {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        local_90.type_._0_8_ = (long)&local_90 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,
                   "struct_extract with an integer key can only be used on unnamed structs, use a string key instead"
                   ,"");
        BinderException::BinderException(pBVar9,(string *)&local_90);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    if (pvVar5 != type) {
      pvVar5->id_ = (pEVar4->return_type).id_;
      pvVar5->physical_type_ = (pEVar4->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar5->type_info_,&(pEVar4->return_type).type_info_);
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])(pEVar4);
    if ((char)iVar2 == '\0') {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar4);
      if ((char)iVar2 == '\0') {
        pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
        local_90.type_._0_8_ = (long)&local_90 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Key index for struct_extract needs to be a constant value",
                   "");
        BinderException::BinderException(pBVar9,(string *)&local_90);
        __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar3);
      ExpressionExecutor::EvaluateScalar(&local_90,context,expr,false);
      params = Value::GetValue<long>(&local_90);
      if ((0 < (long)params) &&
         (params <= (ulong)(((long)(this_00->
                                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                   ).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->
                                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                   ).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x6db6db6db6db6db7))) {
        uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(params - 1);
        pvVar7 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::operator[](this_00,uVar6);
        if (&(bound_function->super_BaseScalarFunction).return_type != &pvVar7->second) {
          (bound_function->super_BaseScalarFunction).return_type.id_ = (pvVar7->second).id_;
          (bound_function->super_BaseScalarFunction).return_type.physical_type_ =
               (pvVar7->second).physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
                     &(pvVar7->second).type_info_);
        }
        uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(params - 1);
        puVar8 = (undefined8 *)operator_new(0x10);
        *puVar8 = &PTR__FunctionData_02487c90;
        puVar8[1] = uVar6;
        *(undefined8 **)this = puVar8;
        Value::~Value(&local_90);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
      }
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Key index %lld for struct_extract out of range - expected an index between 1 and %llu"
                 ,"");
      BinderException::BinderException<long,unsigned_long>
                (pBVar9,&local_50,params,
                 ((long)(this_00->
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_02);
  }
  __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> StructExtractBindInternal(ClientContext &context, ScalarFunction &bound_function,
                                                          vector<unique_ptr<Expression>> &arguments,
                                                          bool struct_extract) {
	D_ASSERT(bound_function.arguments.size() == 2);
	auto &child_type = arguments[0]->return_type;
	if (child_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	D_ASSERT(LogicalTypeId::STRUCT == child_type.id());
	auto &struct_children = StructType::GetChildTypes(child_type);
	if (struct_children.empty()) {
		throw InternalException("Can't extract something from an empty struct");
	}
	if (struct_extract && !StructType::IsUnnamed(child_type)) {
		throw BinderException(
		    "struct_extract with an integer key can only be used on unnamed structs, use a string key instead");
	}
	bound_function.arguments[0] = child_type;

	auto &key_child = arguments[1];
	if (key_child->HasParameter()) {
		throw ParameterNotResolvedException();
	}

	if (!key_child->IsFoldable()) {
		throw BinderException("Key index for struct_extract needs to be a constant value");
	}
	Value key_val = ExpressionExecutor::EvaluateScalar(context, *key_child);
	auto index = key_val.GetValue<int64_t>();
	if (index <= 0 || idx_t(index) > struct_children.size()) {
		throw BinderException("Key index %lld for struct_extract out of range - expected an index between 1 and %llu",
		                      index, struct_children.size());
	}
	bound_function.return_type = struct_children[NumericCast<idx_t>(index - 1)].second;
	return StructExtractAtFun::GetBindData(NumericCast<idx_t>(index - 1));
}